

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

object * newAnonymousObj(int cl)

{
  object *poVar1;
  object *local_20;
  object *x;
  object *newObj;
  int cl_local;
  
  for (local_20 = topScope; local_20->next != guard; local_20 = local_20->next) {
  }
  poVar1 = (object *)calloc(1,0x90);
  poVar1->cl = cl;
  poVar1->next = guard;
  local_20->next = poVar1;
  return poVar1;
}

Assistant:

object * newAnonymousObj(int cl) {
	variable struct object *newObj; variable struct object *x;
	newObj=NULL; x=topScope;
	while (x->next != guard) { 
		x = x->next; 
	}
	allocMem(newObj);
	newObj->cl = cl; newObj->next = guard; x->next = newObj;
	return newObj;
}